

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidget::showFullScreen(QWidget *this)

{
  ensurePolished(this);
  setWindowState(this,(WindowStates)(*(uint *)&this->data->field_0x10 & 8 | 4));
  (**(code **)(*(long *)this + 0x68))(this,1);
  activateWindow(this);
  return;
}

Assistant:

void QWidget::showFullScreen()
{
    ensurePolished();

    setWindowState((windowState() & ~(Qt::WindowMinimized | Qt::WindowMaximized))
                   | Qt::WindowFullScreen);
    setVisible(true);
#if !defined Q_OS_QNX // On QNX this window will be activated anyway from libscreen
                      // activating it here before libscreen activates it causes problems
    activateWindow();
#endif
}